

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::Field> *
wasm::WATParser::anon_unknown_11::
fieldtype<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>
          (Result<wasm::Field> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  FieldT field_00;
  FieldT FVar1;
  bool bVar2;
  Field *pFVar3;
  basic_string_view<char,_std::char_traits<char>_> expected;
  FieldT local_118;
  allocator<char> local_101;
  string local_100;
  Err local_e0;
  uint local_bc;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::Field> _val;
  Result<wasm::Field> field;
  Mutability local_1c;
  Mutability mutability;
  ParseTypeDefsCtx *ctx_local;
  
  expected = sv("mut",3);
  bVar2 = ParseInput::takeSExprStart(&ctx->in,expected);
  local_1c = (Mutability)bVar2;
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err> + 0x20);
  storagetype<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>
            ((Result<wasm::Field> *)__return_storage_ptr___00,ctx);
  Result<wasm::Field>::Result
            ((Result<wasm::Field> *)local_80,(Result<wasm::Field> *)__return_storage_ptr___00);
  local_98 = Result<wasm::Field>::getErr((Result<wasm::Field> *)local_80);
  bVar2 = local_98 != (Err *)0x0;
  if (bVar2) {
    WATParser::Err::Err(&local_b8,local_98);
    Result<wasm::Field>::Result(__return_storage_ptr__,&local_b8);
    WATParser::Err::~Err(&local_b8);
  }
  local_bc = (uint)bVar2;
  Result<wasm::Field>::~Result((Result<wasm::Field> *)local_80);
  FVar1.packedType = local_118.packedType;
  FVar1.mutable_ = local_118.mutable_;
  FVar1.type.id = local_118.type.id;
  if (local_bc == 0) {
    if ((local_1c != Mutable) || (bVar2 = ParseInput::takeRParen(&ctx->in), bVar2)) {
      pFVar3 = Result<wasm::Field>::operator*
                         ((Result<wasm::Field> *)
                          ((long)&_val.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                                  super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                                  super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                                  super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                                  super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err> + 0x20))
      ;
      field_00.type.id = (pFVar3->type).id;
      field_00.packedType = pFVar3->packedType;
      field_00.mutable_ = pFVar3->mutable_;
      local_118 = TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>::
                  makeFieldType(&ctx->
                                 super_TypeParserCtx<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>
                                ,field_00,local_1c);
      Result<wasm::Field>::Result<wasm::Field>(__return_storage_ptr__,&local_118);
      local_bc = 1;
      FVar1 = local_118;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"expected end of field type",&local_101);
      ParseInput::err(&local_e0,&ctx->in,&local_100);
      Result<wasm::Field>::Result(__return_storage_ptr__,&local_e0);
      WATParser::Err::~Err(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      FVar1.packedType = local_118.packedType;
      FVar1.mutable_ = local_118.mutable_;
      FVar1.type.id = local_118.type.id;
      local_bc = 1;
    }
  }
  local_118 = FVar1;
  Result<wasm::Field>::~Result
            ((Result<wasm::Field> *)
             ((long)&_val.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldT> fieldtype(Ctx& ctx) {
  auto mutability = Immutable;
  if (ctx.in.takeSExprStart("mut"sv)) {
    mutability = Mutable;
  }

  auto field = storagetype(ctx);
  CHECK_ERR(field);

  if (mutability == Mutable) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of field type");
    }
  }

  return ctx.makeFieldType(*field, mutability);
}